

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O0

void Imf_2_5::Xdr::read<Imf_2_5::CharPtrIO,char_const*>(char **in,int n,char *v)

{
  char *in_RDX;
  int in_ESI;
  char **in_RDI;
  char *local_18;
  int local_c;
  
  local_c = in_ESI;
  for (local_18 = in_RDX;
      (-1 < local_c && (CharPtrIO::readChars(in_RDI,local_18,1), *local_18 != '\0'));
      local_18 = local_18 + 1) {
    local_c = local_c + -1;
  }
  return;
}

Assistant:

void
read (T &in, int n, char v[])		// zero-terminated string
{
    while (n >= 0)
    {
	S::readChars (in, v, 1);

	if (*v == 0)
	    break;

	--n;
	++v;
    }
}